

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::VariablesQbSetSpeed(ChMatterMeshless *this,double step)

{
  double dVar1;
  double dVar2;
  pointer psVar3;
  element_type *peVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  double dVar8;
  ChVector<double> local_68;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_48 [24];
  
  uVar6 = 0;
  dVar8 = 1.0 / step;
  while( true ) {
    uVar7 = (ulong)uVar6;
    psVar3 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar7)
    break;
    peVar4 = psVar3[uVar7].
             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar5 = *(undefined1 (*) [16])
              ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x20))->m_data;
    dVar1 = *(double *)((long)&peVar4->super_ChNodeXYZ + 0x30);
    ChVariables::Get_qb((ChVectorRef *)local_48,&(peVar4->variables).super_ChVariables);
    ChVector<double>::
    ChVector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
              (&local_68,local_48,(type *)0x0);
    if ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x20U) != &local_68) {
      ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x20))->m_data[0] = local_68.m_data[0];
      *(double *)((long)&peVar4->super_ChNodeXYZ + 0x28) = local_68.m_data[1];
      *(double *)((long)&peVar4->super_ChNodeXYZ + 0x30) = local_68.m_data[2];
    }
    if ((step != 0.0) || (NAN(step))) {
      peVar4 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar2 = *(double *)((long)&peVar4->super_ChNodeXYZ + 0x30);
      auVar5 = vsubpd_avx(*(undefined1 (*) [16])
                           ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x20))->m_data,
                          auVar5);
      ((ChVector<double> *)((long)&peVar4->super_ChNodeXYZ + 0x38))->m_data[0] =
           auVar5._0_8_ * dVar8;
      *(double *)((long)&peVar4->super_ChNodeXYZ + 0x40) = auVar5._8_8_ * dVar8;
      *(double *)((long)&peVar4->super_ChNodeXYZ + 0x48) = (dVar2 - dVar1) * dVar8;
    }
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void ChMatterMeshless::VariablesQbSetSpeed(double step) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        ChVector<> old_pos_dt = nodes[j]->GetPos_dt();

        // from 'qb' vector, sets body speed, and updates auxiliary data
        nodes[j]->SetPos_dt(nodes[j]->variables.Get_qb());

        // Compute accel. by BDF (approximate by differentiation);
        if (step) {
            nodes[j]->SetPos_dtdt((nodes[j]->GetPos_dt() - old_pos_dt) / step);
        }
    }
}